

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreationTest.cpp
# Opt level: O0

void __thiscall
TApp_OptionFromDefaults_Test::TApp_OptionFromDefaults_Test(TApp_OptionFromDefaults_Test *this)

{
  TApp_OptionFromDefaults_Test *this_local;
  
  TApp::TApp(&this->super_TApp);
  (this->super_TApp).super_Test._vptr_Test =
       (_func_int **)&PTR__TApp_OptionFromDefaults_Test_001c00d0;
  return;
}

Assistant:

TEST_F(TApp, OptionFromDefaults) {
    app.option_defaults()->required();

    // Options should remember defaults
    int x;
    auto opt = app.add_option("--simple", x);
    EXPECT_TRUE(opt->get_required());

    // Flags cannot be required
    auto flag = app.add_flag("--other");
    EXPECT_FALSE(flag->get_required());

    app.option_defaults()->required(false);
    auto opt2 = app.add_option("--simple2", x);
    EXPECT_FALSE(opt2->get_required());

    app.option_defaults()->required()->ignore_case();

    auto opt3 = app.add_option("--simple3", x);
    EXPECT_TRUE(opt3->get_required());
    EXPECT_TRUE(opt3->get_ignore_case());
}